

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O1

void __thiscall flyd::Signal::AddSingal(Signal *this,int signo,SigFunction sighandler)

{
  char *pcVar1;
  int iVar2;
  LogStream *pLVar3;
  char **ppcVar4;
  SourceFile file;
  sigaction sa;
  _union_1457 local_1080;
  sigset_t local_1078;
  undefined4 local_ff8;
  undefined1 local_fe8 [8];
  LogStream local_fe0;
  
  local_fe8._0_4_ = signo;
  local_fe0._0_8_ = sighandler;
  std::
  _Hashtable<int,std::pair<int_const,void(*)(int,siginfo_t*,void*)>,std::allocator<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>
            ((_Hashtable<int,std::pair<int_const,void(*)(int,siginfo_t*,void*)>,std::allocator<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&signals_);
  local_ff8 = 4;
  local_1080 = (_union_1457)sighandler;
  sigemptyset(&local_1078);
  iVar2 = sigaction(signo,(sigaction *)&local_1080,(sigaction *)0x0);
  if (iVar2 < 0) {
    file._8_8_ = 0xe;
    file.data_ = "flyd_signal.cc";
    muduo::Logger::Logger((Logger *)local_fe8,file,0x16,ERROR);
    pLVar3 = muduo::LogStream::operator<<(&local_fe0,signo);
    ppcVar4 = &(pLVar3->buffer_).cur_;
    pcVar1 = (pLVar3->buffer_).cur_;
    if (0x13 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,"信号注册失败\n",0x13);
      *ppcVar4 = *ppcVar4 + 0x13;
    }
    muduo::Logger::~Logger((Logger *)local_fe8);
  }
  return;
}

Assistant:

void flyd::Signal::AddSingal(int signo, SigFunction sighandler)
{
    struct sigaction sa;// 定义一个管理信号的结构体
    signals_.insert({signo, sighandler});
    sa.sa_sigaction = sighandler;
    sa.sa_flags = SA_SIGINFO;//令sa_sigaction指定的信号处理程序生效
    sigemptyset(&sa.sa_mask);
    if( sigaction(signo, &sa, NULL) < 0)
        LOG_ERROR << signo << "信号注册失败\n";
}